

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O2

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::AddColumnInfo::Copy(AddColumnInfo *this)

{
  AlterInfo *in_RSI;
  AlterEntryData local_150;
  ColumnDefinition local_e8;
  
  AlterInfo::GetAlterEntryData(&local_150,in_RSI);
  ColumnDefinition::Copy(&local_e8,(ColumnDefinition *)(in_RSI + 1));
  make_uniq_base<duckdb::AlterInfo,duckdb::AddColumnInfo,duckdb::AlterEntryData,duckdb::ColumnDefinition,bool_const&>
            ((duckdb *)this,&local_150,&local_e8,(bool *)in_RSI[2].name.field_2._M_local_buf);
  ColumnDefinition::~ColumnDefinition(&local_e8);
  AlterEntryData::~AlterEntryData(&local_150);
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<AlterInfo> AddColumnInfo::Copy() const {
	return make_uniq_base<AlterInfo, AddColumnInfo>(GetAlterEntryData(), new_column.Copy(), if_column_not_exists);
}